

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,ByteData160 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData160 *local_18;
  ByteData160 *data_local;
  
  local_18 = data;
  data_local = (ByteData160 *)__return_storage_ptr__;
  ByteData160::GetBytes(&local_30,data);
  Sha256(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const ByteData160 &data) {
  return Sha256(data.GetBytes());
}